

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void cueify_sha1_transform(uint32_t *state,uint8_t *buffer)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  CHAR64LONG16 *block;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint8_t *buffer_local;
  uint32_t *state_local;
  
  uVar4 = *state;
  uVar2 = state[1];
  uVar5 = state[2];
  uVar3 = state[3];
  uVar1 = state[4];
  uVar6 = *(int *)buffer << 0x18 | *(uint *)buffer >> 8 & 0xff00ff00 |
          (*(uint *)buffer & 0xff00) << 8 | *(uint *)buffer >> 0x18;
  *(uint *)buffer = uVar6;
  uVar6 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar6 + 0x5a827999 + (uVar4 << 5 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 << 0x1e | uVar2 >> 2;
  uVar7 = *(int *)(buffer + 4) << 0x18 | *(uint *)(buffer + 4) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 4) & 0xff00) << 8 | *(uint *)(buffer + 4) >> 0x18;
  *(uint *)(buffer + 4) = uVar7;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar7 + 0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 << 0x1e | uVar4 >> 2;
  uVar7 = *(int *)(buffer + 8) << 0x18 | *(uint *)(buffer + 8) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 8) & 0xff00) << 8 | *(uint *)(buffer + 8) >> 0x18;
  *(uint *)(buffer + 8) = uVar7;
  uVar5 = (uVar6 & (uVar4 ^ uVar2) ^ uVar2) + uVar7 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = *(int *)(buffer + 0xc) << 0x18 | *(uint *)(buffer + 0xc) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0xc) & 0xff00) << 8 | *(uint *)(buffer + 0xc) >> 0x18;
  *(uint *)(buffer + 0xc) = uVar7;
  uVar2 = (uVar3 & (uVar6 ^ uVar4) ^ uVar4) + uVar7 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = *(int *)(buffer + 0x10) << 0x18 | *(uint *)(buffer + 0x10) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x10) & 0xff00) << 8 | *(uint *)(buffer + 0x10) >> 0x18;
  *(uint *)(buffer + 0x10) = uVar7;
  uVar4 = (uVar5 & (uVar3 ^ uVar6) ^ uVar6) + uVar7 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = *(int *)(buffer + 0x14) << 0x18 | *(uint *)(buffer + 0x14) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x14) & 0xff00) << 8 | *(uint *)(buffer + 0x14) >> 0x18;
  *(uint *)(buffer + 0x14) = uVar7;
  uVar6 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar7 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = *(int *)(buffer + 0x18) << 0x18 | *(uint *)(buffer + 0x18) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x18) & 0xff00) << 8 | *(uint *)(buffer + 0x18) >> 0x18;
  *(uint *)(buffer + 0x18) = uVar7;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar7 + 0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = *(int *)(buffer + 0x1c) << 0x18 | *(uint *)(buffer + 0x1c) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x1c) & 0xff00) << 8 | *(uint *)(buffer + 0x1c) >> 0x18;
  *(uint *)(buffer + 0x1c) = uVar7;
  uVar5 = (uVar6 & (uVar4 ^ uVar2) ^ uVar2) + uVar7 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = *(int *)(buffer + 0x20) << 0x18 | *(uint *)(buffer + 0x20) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x20) & 0xff00) << 8 | *(uint *)(buffer + 0x20) >> 0x18;
  *(uint *)(buffer + 0x20) = uVar7;
  uVar2 = (uVar3 & (uVar6 ^ uVar4) ^ uVar4) + uVar7 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = *(int *)(buffer + 0x24) << 0x18 | *(uint *)(buffer + 0x24) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x24) & 0xff00) << 8 | *(uint *)(buffer + 0x24) >> 0x18;
  *(uint *)(buffer + 0x24) = uVar7;
  uVar4 = (uVar5 & (uVar3 ^ uVar6) ^ uVar6) + uVar7 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = *(int *)(buffer + 0x28) << 0x18 | *(uint *)(buffer + 0x28) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x28) & 0xff00) << 8 | *(uint *)(buffer + 0x28) >> 0x18;
  *(uint *)(buffer + 0x28) = uVar7;
  uVar6 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar7 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = *(int *)(buffer + 0x2c) << 0x18 | *(uint *)(buffer + 0x2c) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x2c) & 0xff00) << 8 | *(uint *)(buffer + 0x2c) >> 0x18;
  *(uint *)(buffer + 0x2c) = uVar7;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar7 + 0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = *(int *)(buffer + 0x30) << 0x18 | *(uint *)(buffer + 0x30) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x30) & 0xff00) << 8 | *(uint *)(buffer + 0x30) >> 0x18;
  *(uint *)(buffer + 0x30) = uVar7;
  uVar5 = (uVar6 & (uVar4 ^ uVar2) ^ uVar2) + uVar7 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = *(int *)(buffer + 0x34) << 0x18 | *(uint *)(buffer + 0x34) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x34) & 0xff00) << 8 | *(uint *)(buffer + 0x34) >> 0x18;
  *(uint *)(buffer + 0x34) = uVar7;
  uVar2 = (uVar3 & (uVar6 ^ uVar4) ^ uVar4) + uVar7 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = *(int *)(buffer + 0x38) << 0x18 | *(uint *)(buffer + 0x38) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x38) & 0xff00) << 8 | *(uint *)(buffer + 0x38) >> 0x18;
  *(uint *)(buffer + 0x38) = uVar7;
  uVar4 = (uVar5 & (uVar3 ^ uVar6) ^ uVar6) + uVar7 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = *(int *)(buffer + 0x3c) << 0x18 | *(uint *)(buffer + 0x3c) >> 8 & 0xff00ff00 |
          (*(uint *)(buffer + 0x3c) & 0xff00) << 8 | *(uint *)(buffer + 0x3c) >> 0x18;
  *(uint *)(buffer + 0x3c) = uVar7;
  uVar6 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar7 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 8) ^
          *(uint *)buffer) << 1 |
          (*(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 8) ^
          *(uint *)buffer) >> 0x1f;
  *(uint *)buffer = uVar7;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar7 + 0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0xc) ^
          *(uint *)(buffer + 4)) << 1 |
          (*(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0xc) ^
          *(uint *)(buffer + 4)) >> 0x1f;
  *(uint *)(buffer + 4) = uVar7;
  uVar5 = (uVar6 & (uVar4 ^ uVar2) ^ uVar2) + uVar7 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x10) ^
          *(uint *)(buffer + 8)) << 1 |
          (*(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x10) ^
          *(uint *)(buffer + 8)) >> 0x1f;
  *(uint *)(buffer + 8) = uVar7;
  uVar2 = (uVar3 & (uVar6 ^ uVar4) ^ uVar4) + uVar7 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)buffer ^ *(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x14) ^
          *(uint *)(buffer + 0xc)) << 1 |
          (*(uint *)buffer ^ *(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x14) ^
          *(uint *)(buffer + 0xc)) >> 0x1f;
  *(uint *)(buffer + 0xc) = uVar7;
  uVar4 = (uVar5 & (uVar3 ^ uVar6) ^ uVar6) + uVar7 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x18) ^
          *(uint *)(buffer + 0x10)) << 1 |
          (*(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x18) ^
          *(uint *)(buffer + 0x10)) >> 0x1f;
  *(uint *)(buffer + 0x10) = uVar7;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar7 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x1c) ^
          *(uint *)(buffer + 0x14)) << 1 |
          (*(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x1c) ^
          *(uint *)(buffer + 0x14)) >> 0x1f;
  *(uint *)(buffer + 0x14) = uVar7;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar7 + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x20) ^
          *(uint *)(buffer + 0x18)) << 1 |
          (*(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x20) ^
          *(uint *)(buffer + 0x18)) >> 0x1f;
  *(uint *)(buffer + 0x18) = uVar7;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar7 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x24) ^
          *(uint *)(buffer + 0x1c)) << 1 |
          (*(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x24) ^
          *(uint *)(buffer + 0x1c)) >> 0x1f;
  *(uint *)(buffer + 0x1c) = uVar7;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar7 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 0x14) ^ *(uint *)buffer ^ *(uint *)(buffer + 0x28) ^
          *(uint *)(buffer + 0x20)) << 1 |
          (*(uint *)(buffer + 0x14) ^ *(uint *)buffer ^ *(uint *)(buffer + 0x28) ^
          *(uint *)(buffer + 0x20)) >> 0x1f;
  *(uint *)(buffer + 0x20) = uVar7;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar7 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 0x18) ^ *(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x2c) ^
          *(uint *)(buffer + 0x24)) << 1 |
          (*(uint *)(buffer + 0x18) ^ *(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x2c) ^
          *(uint *)(buffer + 0x24)) >> 0x1f;
  *(uint *)(buffer + 0x24) = uVar7;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar7 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x30) ^
          *(uint *)(buffer + 0x28)) << 1 |
          (*(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x30) ^
          *(uint *)(buffer + 0x28)) >> 0x1f;
  *(uint *)(buffer + 0x28) = uVar7;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar7 + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x34) ^
          *(uint *)(buffer + 0x2c)) << 1 |
          (*(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x34) ^
          *(uint *)(buffer + 0x2c)) >> 0x1f;
  *(uint *)(buffer + 0x2c) = uVar7;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar7 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x38) ^
          *(uint *)(buffer + 0x30)) << 1 |
          (*(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x38) ^
          *(uint *)(buffer + 0x30)) >> 0x1f;
  *(uint *)(buffer + 0x30) = uVar7;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar7 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x14) ^ *(uint *)(buffer + 0x3c) ^
          *(uint *)(buffer + 0x34)) << 1 |
          (*(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x14) ^ *(uint *)(buffer + 0x3c) ^
          *(uint *)(buffer + 0x34)) >> 0x1f;
  *(uint *)(buffer + 0x34) = uVar7;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar7 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x18) ^ *(uint *)buffer ^
          *(uint *)(buffer + 0x38)) << 1 |
          (*(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x18) ^ *(uint *)buffer ^
          *(uint *)(buffer + 0x38)) >> 0x1f;
  *(uint *)(buffer + 0x38) = uVar7;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar7 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 4) ^
          *(uint *)(buffer + 0x3c)) << 1 |
          (*(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 4) ^
          *(uint *)(buffer + 0x3c)) >> 0x1f;
  *(uint *)(buffer + 0x3c) = uVar7;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar7 + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 8) ^
          *(uint *)buffer) << 1 |
          (*(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 8) ^
          *(uint *)buffer) >> 0x1f;
  *(uint *)buffer = uVar7;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar7 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0xc) ^
          *(uint *)(buffer + 4)) << 1 |
          (*(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0xc) ^
          *(uint *)(buffer + 4)) >> 0x1f;
  *(uint *)(buffer + 4) = uVar7;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar7 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x10) ^
          *(uint *)(buffer + 8)) << 1 |
          (*(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x10) ^
          *(uint *)(buffer + 8)) >> 0x1f;
  *(uint *)(buffer + 8) = uVar7;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar7 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)buffer ^ *(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x14) ^
          *(uint *)(buffer + 0xc)) << 1 |
          (*(uint *)buffer ^ *(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x14) ^
          *(uint *)(buffer + 0xc)) >> 0x1f;
  *(uint *)(buffer + 0xc) = uVar7;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar7 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x18) ^
          *(uint *)(buffer + 0x10)) << 1 |
          (*(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x18) ^
          *(uint *)(buffer + 0x10)) >> 0x1f;
  *(uint *)(buffer + 0x10) = uVar7;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar7 + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x1c) ^
          *(uint *)(buffer + 0x14)) << 1 |
          (*(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x1c) ^
          *(uint *)(buffer + 0x14)) >> 0x1f;
  *(uint *)(buffer + 0x14) = uVar7;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar7 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x20) ^
          *(uint *)(buffer + 0x18)) << 1 |
          (*(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x20) ^
          *(uint *)(buffer + 0x18)) >> 0x1f;
  *(uint *)(buffer + 0x18) = uVar7;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar7 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x24) ^
          *(uint *)(buffer + 0x1c)) << 1 |
          (*(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x24) ^
          *(uint *)(buffer + 0x1c)) >> 0x1f;
  *(uint *)(buffer + 0x1c) = uVar7;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar7 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 0x14) ^ *(uint *)buffer ^ *(uint *)(buffer + 0x28) ^
          *(uint *)(buffer + 0x20)) << 1 |
          (*(uint *)(buffer + 0x14) ^ *(uint *)buffer ^ *(uint *)(buffer + 0x28) ^
          *(uint *)(buffer + 0x20)) >> 0x1f;
  *(uint *)(buffer + 0x20) = uVar7;
  uVar6 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar7 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 0x18) ^ *(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x2c) ^
          *(uint *)(buffer + 0x24)) << 1 |
          (*(uint *)(buffer + 0x18) ^ *(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x2c) ^
          *(uint *)(buffer + 0x24)) >> 0x1f;
  *(uint *)(buffer + 0x24) = uVar7;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar7 + -0x70e44324 +
          (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x30) ^
          *(uint *)(buffer + 0x28)) << 1 |
          (*(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x30) ^
          *(uint *)(buffer + 0x28)) >> 0x1f;
  *(uint *)(buffer + 0x28) = uVar7;
  uVar5 = ((uVar6 | uVar4) & uVar2 | uVar6 & uVar4) + uVar7 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x34) ^
          *(uint *)(buffer + 0x2c)) << 1 |
          (*(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x34) ^
          *(uint *)(buffer + 0x2c)) >> 0x1f;
  *(uint *)(buffer + 0x2c) = uVar7;
  uVar2 = ((uVar3 | uVar6) & uVar4 | uVar3 & uVar6) + uVar7 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x38) ^
          *(uint *)(buffer + 0x30)) << 1 |
          (*(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x38) ^
          *(uint *)(buffer + 0x30)) >> 0x1f;
  *(uint *)(buffer + 0x30) = uVar7;
  uVar4 = ((uVar5 | uVar3) & uVar6 | uVar5 & uVar3) + uVar7 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x14) ^ *(uint *)(buffer + 0x3c) ^
          *(uint *)(buffer + 0x34)) << 1 |
          (*(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x14) ^ *(uint *)(buffer + 0x3c) ^
          *(uint *)(buffer + 0x34)) >> 0x1f;
  *(uint *)(buffer + 0x34) = uVar7;
  uVar6 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar7 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x18) ^ *(uint *)buffer ^
          *(uint *)(buffer + 0x38)) << 1 |
          (*(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x18) ^ *(uint *)buffer ^
          *(uint *)(buffer + 0x38)) >> 0x1f;
  *(uint *)(buffer + 0x38) = uVar7;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar7 + -0x70e44324 +
          (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 4) ^
          *(uint *)(buffer + 0x3c)) << 1 |
          (*(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 4) ^
          *(uint *)(buffer + 0x3c)) >> 0x1f;
  *(uint *)(buffer + 0x3c) = uVar7;
  uVar5 = ((uVar6 | uVar4) & uVar2 | uVar6 & uVar4) + uVar7 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 8) ^
          *(uint *)buffer) << 1 |
          (*(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 8) ^
          *(uint *)buffer) >> 0x1f;
  *(uint *)buffer = uVar7;
  uVar2 = ((uVar3 | uVar6) & uVar4 | uVar3 & uVar6) + uVar7 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0xc) ^
          *(uint *)(buffer + 4)) << 1 |
          (*(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0xc) ^
          *(uint *)(buffer + 4)) >> 0x1f;
  *(uint *)(buffer + 4) = uVar7;
  uVar4 = ((uVar5 | uVar3) & uVar6 | uVar5 & uVar3) + uVar7 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x10) ^
          *(uint *)(buffer + 8)) << 1 |
          (*(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x10) ^
          *(uint *)(buffer + 8)) >> 0x1f;
  *(uint *)(buffer + 8) = uVar7;
  uVar6 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar7 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)buffer ^ *(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x14) ^
          *(uint *)(buffer + 0xc)) << 1 |
          (*(uint *)buffer ^ *(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x14) ^
          *(uint *)(buffer + 0xc)) >> 0x1f;
  *(uint *)(buffer + 0xc) = uVar7;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar7 + -0x70e44324 +
          (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x18) ^
          *(uint *)(buffer + 0x10)) << 1 |
          (*(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x18) ^
          *(uint *)(buffer + 0x10)) >> 0x1f;
  *(uint *)(buffer + 0x10) = uVar7;
  uVar5 = ((uVar6 | uVar4) & uVar2 | uVar6 & uVar4) + uVar7 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x1c) ^
          *(uint *)(buffer + 0x14)) << 1 |
          (*(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x1c) ^
          *(uint *)(buffer + 0x14)) >> 0x1f;
  *(uint *)(buffer + 0x14) = uVar7;
  uVar2 = ((uVar3 | uVar6) & uVar4 | uVar3 & uVar6) + uVar7 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x20) ^
          *(uint *)(buffer + 0x18)) << 1 |
          (*(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x20) ^
          *(uint *)(buffer + 0x18)) >> 0x1f;
  *(uint *)(buffer + 0x18) = uVar7;
  uVar4 = ((uVar5 | uVar3) & uVar6 | uVar5 & uVar3) + uVar7 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x24) ^
          *(uint *)(buffer + 0x1c)) << 1 |
          (*(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x24) ^
          *(uint *)(buffer + 0x1c)) >> 0x1f;
  *(uint *)(buffer + 0x1c) = uVar7;
  uVar6 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar7 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 0x14) ^ *(uint *)buffer ^ *(uint *)(buffer + 0x28) ^
          *(uint *)(buffer + 0x20)) << 1 |
          (*(uint *)(buffer + 0x14) ^ *(uint *)buffer ^ *(uint *)(buffer + 0x28) ^
          *(uint *)(buffer + 0x20)) >> 0x1f;
  *(uint *)(buffer + 0x20) = uVar7;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar7 + -0x70e44324 +
          (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 0x18) ^ *(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x2c) ^
          *(uint *)(buffer + 0x24)) << 1 |
          (*(uint *)(buffer + 0x18) ^ *(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x2c) ^
          *(uint *)(buffer + 0x24)) >> 0x1f;
  *(uint *)(buffer + 0x24) = uVar7;
  uVar5 = ((uVar6 | uVar4) & uVar2 | uVar6 & uVar4) + uVar7 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x30) ^
          *(uint *)(buffer + 0x28)) << 1 |
          (*(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x30) ^
          *(uint *)(buffer + 0x28)) >> 0x1f;
  *(uint *)(buffer + 0x28) = uVar7;
  uVar2 = ((uVar3 | uVar6) & uVar4 | uVar3 & uVar6) + uVar7 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x34) ^
          *(uint *)(buffer + 0x2c)) << 1 |
          (*(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x34) ^
          *(uint *)(buffer + 0x2c)) >> 0x1f;
  *(uint *)(buffer + 0x2c) = uVar7;
  uVar4 = ((uVar5 | uVar3) & uVar6 | uVar5 & uVar3) + uVar7 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x38) ^
          *(uint *)(buffer + 0x30)) << 1 |
          (*(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x38) ^
          *(uint *)(buffer + 0x30)) >> 0x1f;
  *(uint *)(buffer + 0x30) = uVar7;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar7 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x14) ^ *(uint *)(buffer + 0x3c) ^
          *(uint *)(buffer + 0x34)) << 1 |
          (*(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x14) ^ *(uint *)(buffer + 0x3c) ^
          *(uint *)(buffer + 0x34)) >> 0x1f;
  *(uint *)(buffer + 0x34) = uVar7;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar7 + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x18) ^ *(uint *)buffer ^
          *(uint *)(buffer + 0x38)) << 1 |
          (*(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x18) ^ *(uint *)buffer ^
          *(uint *)(buffer + 0x38)) >> 0x1f;
  *(uint *)(buffer + 0x38) = uVar7;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar7 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 4) ^
          *(uint *)(buffer + 0x3c)) << 1 |
          (*(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 4) ^
          *(uint *)(buffer + 0x3c)) >> 0x1f;
  *(uint *)(buffer + 0x3c) = uVar7;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar7 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 8) ^
          *(uint *)buffer) << 1 |
          (*(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 8) ^
          *(uint *)buffer) >> 0x1f;
  *(uint *)buffer = uVar7;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar7 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0xc) ^
          *(uint *)(buffer + 4)) << 1 |
          (*(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0xc) ^
          *(uint *)(buffer + 4)) >> 0x1f;
  *(uint *)(buffer + 4) = uVar7;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar7 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x10) ^
          *(uint *)(buffer + 8)) << 1 |
          (*(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x10) ^
          *(uint *)(buffer + 8)) >> 0x1f;
  *(uint *)(buffer + 8) = uVar7;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar7 + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)buffer ^ *(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x14) ^
          *(uint *)(buffer + 0xc)) << 1 |
          (*(uint *)buffer ^ *(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x14) ^
          *(uint *)(buffer + 0xc)) >> 0x1f;
  *(uint *)(buffer + 0xc) = uVar7;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar7 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x18) ^
          *(uint *)(buffer + 0x10)) << 1 |
          (*(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x18) ^
          *(uint *)(buffer + 0x10)) >> 0x1f;
  *(uint *)(buffer + 0x10) = uVar7;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar7 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x1c) ^
          *(uint *)(buffer + 0x14)) << 1 |
          (*(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x34) ^ *(uint *)(buffer + 0x1c) ^
          *(uint *)(buffer + 0x14)) >> 0x1f;
  *(uint *)(buffer + 0x14) = uVar7;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar7 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x20) ^
          *(uint *)(buffer + 0x18)) << 1 |
          (*(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x38) ^ *(uint *)(buffer + 0x20) ^
          *(uint *)(buffer + 0x18)) >> 0x1f;
  *(uint *)(buffer + 0x18) = uVar7;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar7 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar7 = (*(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x24) ^
          *(uint *)(buffer + 0x1c)) << 1 |
          (*(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x3c) ^ *(uint *)(buffer + 0x24) ^
          *(uint *)(buffer + 0x1c)) >> 0x1f;
  *(uint *)(buffer + 0x1c) = uVar7;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar7 + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (*(uint *)(buffer + 0x14) ^ *(uint *)buffer ^ *(uint *)(buffer + 0x28) ^
          *(uint *)(buffer + 0x20)) << 1 |
          (*(uint *)(buffer + 0x14) ^ *(uint *)buffer ^ *(uint *)(buffer + 0x28) ^
          *(uint *)(buffer + 0x20)) >> 0x1f;
  *(uint *)(buffer + 0x20) = uVar7;
  uVar5 = (uVar6 ^ uVar4 ^ uVar2) + uVar7 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = (*(uint *)(buffer + 0x18) ^ *(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x2c) ^
          *(uint *)(buffer + 0x24)) << 1 |
          (*(uint *)(buffer + 0x18) ^ *(uint *)(buffer + 4) ^ *(uint *)(buffer + 0x2c) ^
          *(uint *)(buffer + 0x24)) >> 0x1f;
  *(uint *)(buffer + 0x24) = uVar7;
  uVar2 = (uVar3 ^ uVar6 ^ uVar4) + uVar7 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (*(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x30) ^
          *(uint *)(buffer + 0x28)) << 1 |
          (*(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 8) ^ *(uint *)(buffer + 0x30) ^
          *(uint *)(buffer + 0x28)) >> 0x1f;
  *(uint *)(buffer + 0x28) = uVar7;
  uVar4 = (uVar5 ^ uVar3 ^ uVar6) + uVar7 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (*(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x34) ^
          *(uint *)(buffer + 0x2c)) << 1 |
          (*(uint *)(buffer + 0x20) ^ *(uint *)(buffer + 0xc) ^ *(uint *)(buffer + 0x34) ^
          *(uint *)(buffer + 0x2c)) >> 0x1f;
  *(uint *)(buffer + 0x2c) = uVar7;
  uVar6 = (uVar2 ^ uVar5 ^ uVar3) + uVar7 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar6;
  uVar7 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar2 = (*(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x38) ^
          *(uint *)(buffer + 0x30)) << 1 |
          (*(uint *)(buffer + 0x24) ^ *(uint *)(buffer + 0x10) ^ *(uint *)(buffer + 0x38) ^
          *(uint *)(buffer + 0x30)) >> 0x1f;
  *(uint *)(buffer + 0x30) = uVar2;
  uVar3 = (uVar4 ^ uVar7 ^ uVar5) + uVar2 + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar2 = (*(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x14) ^ *(uint *)(buffer + 0x3c) ^
          *(uint *)(buffer + 0x34)) << 1 |
          (*(uint *)(buffer + 0x28) ^ *(uint *)(buffer + 0x14) ^ *(uint *)(buffer + 0x3c) ^
          *(uint *)(buffer + 0x34)) >> 0x1f;
  *(uint *)(buffer + 0x34) = uVar2;
  uVar5 = (uVar6 ^ uVar4 ^ uVar7) + uVar2 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar2 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = (*(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x18) ^ *(uint *)buffer ^
          *(uint *)(buffer + 0x38)) << 1 |
          (*(uint *)(buffer + 0x2c) ^ *(uint *)(buffer + 0x18) ^ *(uint *)buffer ^
          *(uint *)(buffer + 0x38)) >> 0x1f;
  *(uint *)(buffer + 0x38) = uVar6;
  uVar7 = (uVar3 ^ uVar2 ^ uVar4) + uVar6 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar7;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (*(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 4) ^
          *(uint *)(buffer + 0x3c)) << 1 |
          (*(uint *)(buffer + 0x30) ^ *(uint *)(buffer + 0x1c) ^ *(uint *)(buffer + 4) ^
          *(uint *)(buffer + 0x3c)) >> 0x1f;
  *(uint *)(buffer + 0x3c) = uVar6;
  *state = (uVar5 ^ uVar3 ^ uVar2) + uVar6 + -0x359d3e2a + (uVar7 * 0x20 | uVar7 >> 0x1b) + uVar4 +
           *state;
  state[1] = uVar7 + state[1];
  state[2] = (uVar5 * 0x40000000 | uVar5 >> 2) + state[2];
  state[3] = uVar3 + state[3];
  state[4] = uVar2 + state[4];
  return;
}

Assistant:

void cueify_sha1_transform(uint32_t state[5], const uint8_t buffer[64])
{
    uint32_t a, b, c, d, e;
    typedef union {
        uint8_t c[64];
        uint32_t l[16];
    } CHAR64LONG16;
    CHAR64LONG16* block;

#ifdef SHA1HANDSOFF
    static uint8_t workspace[64];
    block = (CHAR64LONG16*)workspace;
    memcpy(block, buffer, 64);
#else
    block = (CHAR64LONG16*)buffer;
#endif

    /* Copy context->state[] to working vars */
    a = state[0];
    b = state[1];
    c = state[2];
    d = state[3];
    e = state[4];

    /* 4 rounds of 20 operations each. Loop unrolled. */
    R0(a,b,c,d,e, 0); R0(e,a,b,c,d, 1); R0(d,e,a,b,c, 2); R0(c,d,e,a,b, 3);
    R0(b,c,d,e,a, 4); R0(a,b,c,d,e, 5); R0(e,a,b,c,d, 6); R0(d,e,a,b,c, 7);
    R0(c,d,e,a,b, 8); R0(b,c,d,e,a, 9); R0(a,b,c,d,e,10); R0(e,a,b,c,d,11);
    R0(d,e,a,b,c,12); R0(c,d,e,a,b,13); R0(b,c,d,e,a,14); R0(a,b,c,d,e,15);
    R1(e,a,b,c,d,16); R1(d,e,a,b,c,17); R1(c,d,e,a,b,18); R1(b,c,d,e,a,19);
    R2(a,b,c,d,e,20); R2(e,a,b,c,d,21); R2(d,e,a,b,c,22); R2(c,d,e,a,b,23);
    R2(b,c,d,e,a,24); R2(a,b,c,d,e,25); R2(e,a,b,c,d,26); R2(d,e,a,b,c,27);
    R2(c,d,e,a,b,28); R2(b,c,d,e,a,29); R2(a,b,c,d,e,30); R2(e,a,b,c,d,31);
    R2(d,e,a,b,c,32); R2(c,d,e,a,b,33); R2(b,c,d,e,a,34); R2(a,b,c,d,e,35);
    R2(e,a,b,c,d,36); R2(d,e,a,b,c,37); R2(c,d,e,a,b,38); R2(b,c,d,e,a,39);
    R3(a,b,c,d,e,40); R3(e,a,b,c,d,41); R3(d,e,a,b,c,42); R3(c,d,e,a,b,43);
    R3(b,c,d,e,a,44); R3(a,b,c,d,e,45); R3(e,a,b,c,d,46); R3(d,e,a,b,c,47);
    R3(c,d,e,a,b,48); R3(b,c,d,e,a,49); R3(a,b,c,d,e,50); R3(e,a,b,c,d,51);
    R3(d,e,a,b,c,52); R3(c,d,e,a,b,53); R3(b,c,d,e,a,54); R3(a,b,c,d,e,55);
    R3(e,a,b,c,d,56); R3(d,e,a,b,c,57); R3(c,d,e,a,b,58); R3(b,c,d,e,a,59);
    R4(a,b,c,d,e,60); R4(e,a,b,c,d,61); R4(d,e,a,b,c,62); R4(c,d,e,a,b,63);
    R4(b,c,d,e,a,64); R4(a,b,c,d,e,65); R4(e,a,b,c,d,66); R4(d,e,a,b,c,67);
    R4(c,d,e,a,b,68); R4(b,c,d,e,a,69); R4(a,b,c,d,e,70); R4(e,a,b,c,d,71);
    R4(d,e,a,b,c,72); R4(c,d,e,a,b,73); R4(b,c,d,e,a,74); R4(a,b,c,d,e,75);
    R4(e,a,b,c,d,76); R4(d,e,a,b,c,77); R4(c,d,e,a,b,78); R4(b,c,d,e,a,79);

    /* Add the working vars back into context.state[] */
    state[0] += a;
    state[1] += b;
    state[2] += c;
    state[3] += d;
    state[4] += e;

    /* Wipe variables */
    a = b = c = d = e = 0;
}